

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::transformColorSpace
          (ImageT<unsigned_char,_1U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  byte bVar1;
  byte bVar2;
  uint value;
  byte *pbVar3;
  long in_RCX;
  undefined8 *in_RDX;
  long *in_RSI;
  ImageT<unsigned_char,_1U> *in_RDI;
  float fVar4;
  float value_00;
  uint32_t comp_1;
  uint32_t k;
  uint32_t j;
  float origIntensity [3];
  uint32_t comp;
  float brightness [3];
  float intensity [3];
  uint32_t components;
  Color *c;
  uint32_t i;
  uint32_t pixelCount;
  float in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint local_68;
  uint local_64;
  uint local_60;
  float local_5c [3];
  uint local_50;
  float afStack_4c [6];
  uint local_34;
  Color *local_30;
  uint local_28;
  uint local_24;
  long local_20;
  undefined8 *local_18;
  long *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24 = Image::getPixelCount(&in_RDI->super_Image);
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    local_30 = in_RDI->pixels + local_28;
    value = (*(in_RDI->super_Image)._vptr_Image[5])();
    local_34 = cclamp<unsigned_int>(value,0,3);
    for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
      pbVar3 = color<unsigned_char,_1U>::operator[](local_30,local_50);
      bVar1 = *pbVar3;
      fVar4 = color_base<unsigned_char,_1U>::rcpOne();
      afStack_4c[local_50] = (float)bVar1 * fVar4;
      fVar4 = (float)(**(code **)(*local_10 + 8))(afStack_4c[local_50]);
      afStack_4c[(ulong)local_50 + 3] = fVar4;
    }
    if (local_20 != 0) {
      local_5c[0] = afStack_4c[3];
      local_5c[1] = afStack_4c[4];
      local_5c[2] = afStack_4c[5];
      for (local_60 = 0; local_60 < local_34; local_60 = local_60 + 1) {
        afStack_4c[(ulong)local_60 + 3] = 0.0;
        for (local_64 = 0; local_64 < local_34; local_64 = local_64 + 1) {
          afStack_4c[(ulong)local_60 + 3] =
               *(float *)(local_20 + (ulong)local_60 * 0xc + (ulong)local_64 * 4) *
               local_5c[local_64] + afStack_4c[(ulong)local_60 + 3];
        }
      }
    }
    for (local_68 = 0; local_68 < local_34; local_68 = local_68 + 1) {
      fVar4 = (float)(**(code **)*local_18)(afStack_4c[(ulong)local_68 + 3]);
      afStack_4c[local_68] = fVar4;
      fVar4 = afStack_4c[local_68];
      bVar1 = color_base<unsigned_char,_1U>::one();
      value_00 = roundf(fVar4 * (float)bVar1);
      bVar1 = color_base<unsigned_char,_1U>::min();
      bVar2 = color_base<unsigned_char,_1U>::max();
      cclamp<float>(value_00,(float)bVar1,(float)bVar2);
      color<unsigned_char,_1U>::set<float>
                ((color<unsigned_char,_1U> *)CONCAT44(fVar4,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
  }
  return in_RDI;
}

Assistant:

virtual ImageT& transformColorSpace(const TransferFunction& decode, const TransferFunction& encode,
                                        const ColorPrimaryTransform* transformPrimaries) override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            // Don't transform the alpha component.
            uint32_t components = cclamp(getComponentCount(), 0u, 3u);
            float intensity[3];
            float brightness[3];

            // Decode source transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = (float)(c[comp]) * Color::rcpOne();
                intensity[comp] = decode.decode(brightness[comp]);
            }

            // If needed, transform primaries
            if (transformPrimaries != nullptr) {
                float origIntensity[3] = { intensity[0], intensity[1], intensity[2] };
                for (uint32_t j = 0; j < components; ++j) {
                    intensity[j] = 0.f;
                    for (uint32_t k = 0; k < components; ++k)
                        intensity[j] += transformPrimaries->matrix[j][k] * origIntensity[k];
                }
            }

            // Encode destination transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = encode.encode(intensity[comp]);
                // clamp(value, color::min, color::max) is required as static_cast has platform-specific behaviors
                // and on certain platforms can over or underflow
                c.set(comp, cclamp(
                        roundf(brightness[comp] * static_cast<float>(Color::one())),
                        static_cast<float>(Color::min()),
                        static_cast<float>(Color::max())));
            }
        }
        return *this;
    }